

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_update_alleles(bcf_hdr_t *hdr,bcf1_t *line,char **alleles,int nals)

{
  int iVar1;
  int local_4c;
  char *pcStack_48;
  int i;
  char *free_old;
  kstring_t tmp;
  int nals_local;
  char **alleles_local;
  bcf1_t *line_local;
  bcf_hdr_t *hdr_local;
  
  tmp.s._4_4_ = nals;
  memset(&free_old,0,0x18);
  pcStack_48 = (char *)0x0;
  for (local_4c = 0;
      (local_4c < tmp.s._4_4_ &&
      ((alleles[local_4c] < (line->d).als || ((line->d).als + (line->d).m_als <= alleles[local_4c]))
      )); local_4c = local_4c + 1) {
  }
  if (local_4c == tmp.s._4_4_) {
    free_old = (char *)0x0;
    tmp.m = (size_t)(line->d).als;
    tmp.l = (size_t)(line->d).m_als;
  }
  else {
    pcStack_48 = (line->d).als;
  }
  for (local_4c = 0; local_4c < tmp.s._4_4_; local_4c = local_4c + 1) {
    kputs(alleles[local_4c],(kstring_t *)&free_old);
    kputc(0,(kstring_t *)&free_old);
  }
  (line->d).als = (char *)tmp.m;
  (line->d).m_als = (int)tmp.l;
  free(pcStack_48);
  iVar1 = _bcf1_sync_alleles(hdr,line,tmp.s._4_4_);
  return iVar1;
}

Assistant:

int bcf_update_alleles(const bcf_hdr_t *hdr, bcf1_t *line, const char **alleles, int nals)
{
    kstring_t tmp = {0,0,0};
    char *free_old = NULL;

    // If the supplied alleles are not pointers to line->d.als, the existing block can be reused.
    int i;
    for (i=0; i<nals; i++)
        if ( alleles[i]>=line->d.als && alleles[i]<line->d.als+line->d.m_als ) break;
    if ( i==nals )
    {
        // all alleles point elsewhere, reuse the existing block
        tmp.l = 0; tmp.s = line->d.als; tmp.m = line->d.m_als;
    }
    else
        free_old = line->d.als;

    for (i=0; i<nals; i++)
    {
        kputs(alleles[i], &tmp);
        kputc(0, &tmp);
    }
    line->d.als = tmp.s; line->d.m_als = tmp.m;
    free(free_old);
    return _bcf1_sync_alleles(hdr,line,nals);
}